

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.cpp
# Opt level: O1

istream * FIX::operator>>(istream *stream,Settings *s)

{
  const_iterator __position;
  long *plVar1;
  size_t sVar2;
  long lVar3;
  iterator this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string line;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  keyValue;
  char buffer [1024];
  string local_4d8;
  Settings *local_4b8;
  string local_4b0;
  undefined1 local_490 [16];
  _func_int *local_480 [2];
  undefined1 local_470 [56];
  char local_438 [1032];
  
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  local_4b0._M_string_length = 0;
  local_4b0.field_2._M_local_buf[0] = '\0';
  this._M_current =
       (s->m_sections).super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_4b8 = s;
LAB_001b89ab:
  paVar4 = &local_4d8.field_2;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
  plVar1 = (long *)std::istream::getline((char *)stream,(long)local_438,'\0');
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,
                      CONCAT71(local_4b0.field_2._M_allocated_capacity._1_7_,
                               local_4b0.field_2._M_local_buf[0]) + 1);
    }
    return stream;
  }
  local_4d8._M_dataplus._M_p = (pointer)paVar4;
  sVar2 = strlen(local_438);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,local_438,local_438 + sVar2);
  string_strip((string *)local_490,&local_4d8);
  std::__cxx11::string::operator=((string *)&local_4b0,(string *)local_490);
  if ((_func_int **)local_490._0_8_ != local_480) {
    operator_delete((void *)local_490._0_8_,(ulong)(local_480[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if (local_4b0._M_string_length != 0) goto code_r0x001b8a5d;
  goto LAB_001b8a85;
code_r0x001b8a5d:
  if (*local_4b0._M_dataplus._M_p != '#') {
    if (((local_4b0._M_string_length == 0) || (*local_4b0._M_dataplus._M_p != '[')) ||
       (local_4b0._M_dataplus._M_p[local_4b0._M_string_length - 1] != ']')) {
LAB_001b8a85:
      lVar3 = std::__cxx11::string::find((char)&local_4b0,0x3d);
      if (lVar3 != -1) {
        splitKeyValue((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_490,&local_4b0);
        if (this._M_current !=
            (local_4b8->m_sections).
            super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if (local_4b8->m_resolveEnvVars == true) {
            resolveEnvVars(&local_4d8,(string *)local_470);
          }
          else {
            local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4d8,local_470._0_8_,
                       (pointer)(local_470._0_8_ + (long)(_Rb_tree_color *)local_470._8_8_));
          }
          Dictionary::setString(this._M_current,(string *)local_490,&local_4d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((_Base_ptr)local_470._0_8_ != (_Base_ptr)(local_470 + 0x10)) {
          operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
        }
        if ((_func_int **)local_490._0_8_ != local_480) {
          operator_delete((void *)local_490._0_8_,(ulong)(local_480[0] + 1));
        }
      }
    }
    else {
      __position._M_current =
           (local_4b8->m_sections).
           super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
           super__Vector_impl_data._M_finish;
      splitSection(&local_4d8,&local_4b0);
      Dictionary::Dictionary((Dictionary *)local_490,&local_4d8);
      this = std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::_M_insert_rval
                       (&local_4b8->m_sections,__position,(Dictionary *)local_490);
      Dictionary::~Dictionary((Dictionary *)local_490);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  goto LAB_001b89ab;
}

Assistant:

std::istream &operator>>(std::istream &stream, Settings &s) {
  char buffer[1024];
  std::string line;
  Settings::Sections::iterator section = s.m_sections.end();
  ;

  while (stream.getline(buffer, sizeof(buffer))) {
    line = string_strip(buffer);
    if (isComment(line)) {
      continue;
    } else if (isSection(line)) {
      section = s.m_sections.insert(s.m_sections.end(), Dictionary(splitSection(line)));
    } else if (isKeyValue(line)) {
      std::pair<std::string, std::string> keyValue = splitKeyValue(line);
      if (section == s.m_sections.end()) {
        continue;
      }
      (*section).setString(keyValue.first, s.m_resolveEnvVars ? resolveEnvVars(keyValue.second) : keyValue.second);
    }
  }
  return stream;
}